

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

bool P_Thing_Raise(AActor *thing,AActor *raiser)

{
  double dVar1;
  bool bVar2;
  FState *newstate;
  AActor *pAVar3;
  FSoundID local_78;
  TFlags<ActorFlag,_unsigned_int> local_74;
  DVector3 local_70;
  TVector2<double> local_58;
  TFlags<ActorFlag,_unsigned_int> local_44;
  double dStack_40;
  ActorFlags oldflags;
  double oldradius;
  double oldheight;
  AActor *info;
  FState *RaiseState;
  AActor *raiser_local;
  AActor *thing_local;
  
  newstate = AActor::GetRaiseState(thing);
  if (newstate == (FState *)0x0) {
    thing_local._7_1_ = true;
  }
  else {
    pAVar3 = AActor::GetDefault(thing);
    (thing->Vel).Y = 0.0;
    (thing->Vel).X = 0.0;
    dVar1 = thing->Height;
    dStack_40 = thing->radius;
    TFlags<ActorFlag,_unsigned_int>::TFlags(&local_44,&thing->flags);
    TFlags<ActorFlag,_unsigned_int>::operator|=(&thing->flags,MF_SOLID);
    thing->Height = pAVar3->Height;
    thing->radius = pAVar3->radius;
    AActor::Pos(&local_70,thing);
    TVector2<double>::TVector2(&local_58,&local_70);
    bVar2 = P_CheckPosition(thing,&local_58,false);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      FSoundID::FSoundID(&local_78,"vile/raise");
      S_Sound(thing,4,&local_78,1.0,1.001);
      AActor::Revive(thing);
      if (raiser != (AActor *)0x0) {
        AActor::CopyFriendliness(thing,raiser,false,true);
      }
      AActor::SetState(thing,newstate,false);
      thing_local._7_1_ = true;
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::TFlags(&local_74,&local_44);
      TFlags<ActorFlag,_unsigned_int>::operator=(&thing->flags,&local_74);
      thing->radius = dStack_40;
      thing->Height = dVar1;
      thing_local._7_1_ = false;
    }
  }
  return thing_local._7_1_;
}

Assistant:

bool P_Thing_Raise(AActor *thing, AActor *raiser)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return true;	// monster doesn't have a raise state
	}
	
	AActor *info = thing->GetDefault ();

	thing->Vel.X = thing->Vel.Y = 0;

	// [RH] Check against real height and radius
	double oldheight = thing->Height;
	double oldradius = thing->radius;
	ActorFlags oldflags = thing->flags;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;	// [RH] Use real height
	thing->radius = info->radius;	// [RH] Use real radius
	if (!P_CheckPosition (thing, thing->Pos()))
	{
		thing->flags = oldflags;
		thing->radius = oldradius;
		thing->Height = oldheight;
		return false;
	}


	S_Sound (thing, CHAN_BODY, "vile/raise", 1, ATTN_IDLE);

	thing->Revive();

	if (raiser != NULL)
	{
		// Let's copy the friendliness of the one who raised it.
		thing->CopyFriendliness(raiser, false);
	}

	thing->SetState (RaiseState);
	return true;
}